

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

bool __thiscall stream::file::operator==(file *this,file *o)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((char)o->offset == (char)this->offset);
  auVar1[1] = -(*(char *)((long)&o->offset + 1) == *(char *)((long)&this->offset + 1));
  auVar1[2] = -(*(char *)((long)&o->offset + 2) == *(char *)((long)&this->offset + 2));
  auVar1[3] = -(*(char *)((long)&o->offset + 3) == *(char *)((long)&this->offset + 3));
  auVar1[4] = -(*(char *)((long)&o->offset + 4) == *(char *)((long)&this->offset + 4));
  auVar1[5] = -(*(char *)((long)&o->offset + 5) == *(char *)((long)&this->offset + 5));
  auVar1[6] = -(*(char *)((long)&o->offset + 6) == *(char *)((long)&this->offset + 6));
  auVar1[7] = -(*(char *)((long)&o->offset + 7) == *(char *)((long)&this->offset + 7));
  auVar1[8] = -((char)o->size == (char)this->size);
  auVar1[9] = -(*(char *)((long)&o->size + 1) == *(char *)((long)&this->size + 1));
  auVar1[10] = -(*(char *)((long)&o->size + 2) == *(char *)((long)&this->size + 2));
  auVar1[0xb] = -(*(char *)((long)&o->size + 3) == *(char *)((long)&this->size + 3));
  auVar1[0xc] = -(*(char *)((long)&o->size + 4) == *(char *)((long)&this->size + 4));
  auVar1[0xd] = -(*(char *)((long)&o->size + 5) == *(char *)((long)&this->size + 5));
  auVar1[0xe] = -(*(char *)((long)&o->size + 6) == *(char *)((long)&this->size + 6));
  auVar1[0xf] = -(*(char *)((long)&o->size + 7) == *(char *)((long)&this->size + 7));
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf) !=
      0xffff) {
    return false;
  }
  return this->filter == o->filter;
}

Assistant:

bool file::operator==(const file & o) const {
	return (offset == o.offset
	        && size == o.size
	        && filter == o.filter);
}